

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserStates.h
# Opt level: O0

bool gurkenlaeufer::isStepKeyword(string *word)

{
  bool bVar1;
  bool local_11;
  string *word_local;
  
  bVar1 = std::operator==(word,"given");
  local_11 = true;
  if (!bVar1) {
    bVar1 = std::operator==(word,"when");
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator==(word,"then");
      local_11 = true;
      if (!bVar1) {
        bVar1 = std::operator==(word,"and");
        local_11 = true;
        if (!bVar1) {
          local_11 = std::operator==(word,"but");
        }
      }
    }
  }
  return local_11;
}

Assistant:

inline bool isStepKeyword(std::string word)
{
    return word == "given" || word == "when" || word == "then" || word == "and" || word == "but";
}